

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool spirv_cross::CompilerGLSL::is_supported_subgroup_op_in_opengl(Op op,uint32_t *ops)

{
  uint32_t uVar1;
  GroupOperation operation;
  uint32_t *ops_local;
  Op op_local;
  
  if ((op - OpControlBarrier < 2) || (op - OpGroupNonUniformElect < 0xc)) {
    ops_local._7_1_ = true;
  }
  else if (op - OpGroupNonUniformIAdd < 4) {
    uVar1 = ops[3];
    if (((uVar1 == 0) || (uVar1 == 1)) || (uVar1 == 2)) {
      ops_local._7_1_ = true;
    }
    else {
      ops_local._7_1_ = false;
    }
  }
  else {
    ops_local._7_1_ = false;
  }
  return ops_local._7_1_;
}

Assistant:

bool CompilerGLSL::is_supported_subgroup_op_in_opengl(spv::Op op, const uint32_t *ops)
{
	switch (op)
	{
	case OpGroupNonUniformElect:
	case OpGroupNonUniformBallot:
	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	case OpControlBarrier:
	case OpMemoryBarrier:
	case OpGroupNonUniformBallotBitCount:
	case OpGroupNonUniformBallotBitExtract:
	case OpGroupNonUniformInverseBallot:
		return true;
	case OpGroupNonUniformIAdd:
	case OpGroupNonUniformFAdd:
	case OpGroupNonUniformIMul:
	case OpGroupNonUniformFMul:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce || operation == GroupOperationInclusiveScan ||
		    operation == GroupOperationExclusiveScan)
		{
			return true;
		}
		else
		{
			return false;
		}
	}
	default:
		return false;
	}
}